

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwGetWindowFrameSize(GLFWwindow *handle,int *left,int *top,int *right,int *bottom)

{
  _GLFWwindow *window;
  int *bottom_local;
  int *right_local;
  int *top_local;
  int *left_local;
  GLFWwindow *handle_local;
  
  if (handle != (GLFWwindow *)0x0) {
    if (left != (int *)0x0) {
      *left = 0;
    }
    if (top != (int *)0x0) {
      *top = 0;
    }
    if (right != (int *)0x0) {
      *right = 0;
    }
    if (bottom != (int *)0x0) {
      *bottom = 0;
    }
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      _glfwPlatformGetWindowFrameSize((_GLFWwindow *)handle,left,top,right,bottom);
    }
    return;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/src/window.c"
                ,0x292,"void glfwGetWindowFrameSize(GLFWwindow *, int *, int *, int *, int *)");
}

Assistant:

GLFWAPI void glfwGetWindowFrameSize(GLFWwindow* handle,
                                    int* left, int* top,
                                    int* right, int* bottom)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    if (left)
        *left = 0;
    if (top)
        *top = 0;
    if (right)
        *right = 0;
    if (bottom)
        *bottom = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowFrameSize(window, left, top, right, bottom);
}